

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instance.cpp
# Opt level: O3

void __thiscall cs::instance_type::check_declar_var(instance_type *this,iterator it,bool regist)

{
  token_base *ptVar1;
  _func_int **pp_Var2;
  int iVar3;
  token_base **pptVar4;
  internal_error *this_00;
  runtime_error *this_01;
  tree_type<cs::token_base_*> *t;
  _func_int **pp_Var5;
  _func_int **pp_Var6;
  size_t sVar7;
  string local_58;
  iterator local_38;
  
  local_38.mData = it.mData;
  pptVar4 = tree_type<cs::token_base_*>::iterator::data(&local_38);
  if (*pptVar4 == (token_base *)0x0) {
    this_00 = (internal_error *)__cxa_allocate_exception(0x28);
    local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"Null pointer accessed.","")
    ;
    internal_error::internal_error(this_00,&local_58);
    __cxa_throw(this_00,&internal_error::typeinfo,internal_error::~internal_error);
  }
  pptVar4 = tree_type<cs::token_base_*>::iterator::data(&local_38);
  iVar3 = (*(*pptVar4)->_vptr_token_base[2])();
  pptVar4 = tree_type<cs::token_base_*>::iterator::data(&local_38);
  ptVar1 = *pptVar4;
  if (iVar3 == 0xf) {
    pp_Var5 = ptVar1[2]._vptr_token_base;
    pp_Var2 = ptVar1[4]._vptr_token_base;
    if (pp_Var5 != pp_Var2) {
      pp_Var6 = ptVar1[3]._vptr_token_base;
      sVar7 = ptVar1[3].line_num;
      do {
        check_declar_var(this,(tree_node *)*pp_Var5,regist);
        pp_Var5 = pp_Var5 + 1;
        if (pp_Var5 == pp_Var6) {
          pp_Var5 = *(_func_int ***)(sVar7 + 8);
          sVar7 = sVar7 + 8;
          pp_Var6 = pp_Var5 + 0x40;
        }
      } while (pp_Var5 != pp_Var2);
    }
  }
  else {
    if ((ptVar1 == (token_base *)0x0) ||
       (iVar3 = (*ptVar1->_vptr_token_base[2])(ptVar1), iVar3 != 4)) {
      this_01 = (runtime_error *)__cxa_allocate_exception(0x28);
      local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_58,"Wrong grammar for variable declaration.","");
      runtime_error::runtime_error(this_01,&local_58);
      __cxa_throw(this_01,&runtime_error::typeinfo,runtime_error::~runtime_error);
    }
    if (regist) {
      domain_manager::add_record(&(this->super_runtime_type).storage,(string *)(ptVar1 + 3));
    }
  }
  return;
}

Assistant:

void instance_type::check_declar_var(tree_type<token_base *>::iterator it, bool regist)
	{
		if (it.data() == nullptr)
			throw internal_error("Null pointer accessed.");
		if (it.data()->get_type() == token_types::parallel) {
			auto &parallel_list = static_cast<token_parallel *>(it.data())->get_parallel();
			for (auto &t: parallel_list)
				check_declar_var(t.root(), regist);
		}
		else {
			token_base *root = it.data();
			if (root == nullptr || root->get_type() != token_types::id)
				throw runtime_error("Wrong grammar for variable declaration.");
			if (regist)
				storage.add_record(static_cast<token_id *>(root)->get_id());
		}
	}